

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaScl.c
# Opt level: O0

int Gia_ManCombMarkUsed_rec(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Gia_Obj_t *pGVar4;
  int local_70;
  int local_58;
  int local_3c;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  
  if (pObj == (Gia_Obj_t *)0x0) {
    p_local._4_4_ = 0;
  }
  else if ((*(ulong *)pObj >> 0x1e & 1) == 0) {
    p_local._4_4_ = 0;
  }
  else {
    *(ulong *)pObj = *(ulong *)pObj & 0xffffffffbfffffff;
    iVar1 = Gia_ObjIsAnd(pObj);
    if (iVar1 == 0) {
      __assert_fail("Gia_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaScl.c"
                    ,0x34,"int Gia_ManCombMarkUsed_rec(Gia_Man_t *, Gia_Obj_t *)");
    }
    iVar1 = Gia_ObjIsBuf(pObj);
    if (iVar1 != 0) {
      __assert_fail("!Gia_ObjIsBuf(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaScl.c"
                    ,0x35,"int Gia_ManCombMarkUsed_rec(Gia_Man_t *, Gia_Obj_t *)");
    }
    pGVar4 = Gia_ObjFanin0(pObj);
    iVar1 = Gia_ManCombMarkUsed_rec(p,pGVar4);
    pGVar4 = Gia_ObjFanin1(pObj);
    iVar2 = Gia_ManCombMarkUsed_rec(p,pGVar4);
    if (p->pNexts == (int *)0x0) {
      local_3c = 0;
    }
    else {
      iVar3 = Gia_ObjId(p,pObj);
      pGVar4 = Gia_ObjNextObj(p,iVar3);
      local_3c = Gia_ManCombMarkUsed_rec(p,pGVar4);
    }
    if (p->pSibls == (int *)0x0) {
      local_58 = 0;
    }
    else {
      iVar3 = Gia_ObjId(p,pObj);
      pGVar4 = Gia_ObjSiblObj(p,iVar3);
      local_58 = Gia_ManCombMarkUsed_rec(p,pGVar4);
    }
    if (p->pMuxes == (uint *)0x0) {
      local_70 = 0;
    }
    else {
      pGVar4 = Gia_ObjFanin2(p,pObj);
      local_70 = Gia_ManCombMarkUsed_rec(p,pGVar4);
    }
    p_local._4_4_ = iVar1 + 1 + iVar2 + local_3c + local_58 + local_70;
  }
  return p_local._4_4_;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Marks unreachable internal nodes and returns their number.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Gia_ManCombMarkUsed_rec( Gia_Man_t * p, Gia_Obj_t * pObj )
{
    if ( pObj == NULL )
        return 0;
    if ( !pObj->fMark0 )
        return 0;
    pObj->fMark0 = 0;
    assert( Gia_ObjIsAnd(pObj) );
    assert( !Gia_ObjIsBuf(pObj) );
    return 1 + Gia_ManCombMarkUsed_rec( p, Gia_ObjFanin0(pObj) )
             + Gia_ManCombMarkUsed_rec( p, Gia_ObjFanin1(pObj) )
             + (p->pNexts ? Gia_ManCombMarkUsed_rec( p, Gia_ObjNextObj(p, Gia_ObjId(p, pObj)) ) : 0)
             + (p->pSibls ? Gia_ManCombMarkUsed_rec( p, Gia_ObjSiblObj(p, Gia_ObjId(p, pObj)) ) : 0)
             + (p->pMuxes ? Gia_ManCombMarkUsed_rec( p, Gia_ObjFanin2(p, pObj) ) : 0);
}